

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::process_label(ldf *data,example *ec)

{
  byte *pbVar1;
  features *pfVar2;
  wclass *pwVar3;
  ulong uVar4;
  v_array<unsigned_char> *in_RSI;
  size_t lab;
  size_t j;
  v_array<COST_SENSITIVE::wclass> *costs;
  features new_fs;
  features *fs;
  v_array<unsigned_char> *lab_00;
  features *local_88;
  undefined1 local_78 [104];
  v_array<unsigned_char> *local_10;
  
  lab_00 = in_RSI + 1;
  local_10 = in_RSI;
  pbVar1 = v_array<unsigned_char>::operator[](in_RSI,0);
  memcpy(local_78,(void *)((long)lab_00 + (ulong)*pbVar1 * 0x68),0x68);
  local_88 = (features *)0x0;
  while( true ) {
    fs = local_88;
    pfVar2 = (features *)
             v_array<COST_SENSITIVE::wclass>::size
                       ((v_array<COST_SENSITIVE::wclass> *)&local_10[0x341]._end);
    if (pfVar2 <= fs) break;
    pwVar3 = v_array<COST_SENSITIVE::wclass>::operator[]
                       ((v_array<COST_SENSITIVE::wclass> *)&local_10[0x341]._end,(size_t)local_88);
    uVar4 = (ulong)pwVar3->x;
    LabelDict::set_label_features
              ((label_feature_map *)(uVar4 | (long)(pwVar3->x - 9.223372e+18) & (long)uVar4 >> 0x3f)
               ,(size_t)lab_00,fs);
    local_88 = (features *)((long)&(local_88->values)._begin + 1);
  }
  return;
}

Assistant:

void inline process_label(ldf& data, example* ec)
{
  auto new_fs = ec->feature_space[ec->indices[0]];
  auto& costs = ec->l.cs.costs;
  for (size_t j = 0; j < costs.size(); j++)
  {
    const auto lab = (size_t)costs[j].x;
    LabelDict::set_label_features(data.label_features, lab, new_fs);
  }
}